

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tl.cpp
# Opt level: O0

bool __thiscall pg::TLSolver::extractTangles(TLSolver *this,int startvertex,bitset *R,int *str)

{
  unsigned_long *__first;
  uint64_t *puVar1;
  undefined1 auVar2 [16];
  bool bVar3;
  uint uVar4;
  size_type sVar5;
  size_t sVar6;
  ostream *poVar7;
  reference piVar8;
  ulong uVar9;
  int iVar10;
  _label_vertex _Var11;
  byte local_47b;
  byte local_47a;
  byte local_479;
  value_type_conflict4 local_470;
  int local_46c;
  iterator iStack_468;
  int v_6;
  iterator __end2_2;
  iterator __begin2_2;
  vector<int,_std::allocator<int>_> *__range2_2;
  value_type piStack_448;
  int c;
  int *_vv;
  int *_tout;
  uint x_1;
  int tidx;
  int local_428;
  _label_vertex local_420;
  Game *local_410;
  int local_408;
  _label_vertex local_400;
  int local_3ec;
  iterator iStack_3e8;
  int v_5;
  iterator __end4;
  iterator __begin4;
  vector<int,_std::allocator<int>_> *__range4;
  int local_3bc;
  iterator iStack_3b8;
  int v_4;
  iterator __end3_1;
  iterator __begin3_1;
  vector<int,_std::allocator<int>_> *__range3_1;
  _label_vertex local_390;
  Game *local_380;
  int local_378;
  _label_vertex local_370;
  int local_35c;
  iterator iStack_358;
  int v_3;
  iterator __end5;
  iterator __begin5;
  vector<int,_std::allocator<int>_> *__range5;
  int local_32c;
  iterator iStack_328;
  int v_2;
  iterator __end3;
  iterator __begin3;
  vector<int,_std::allocator<int>_> *__range3;
  uint local_2fc;
  undefined1 local_2f8 [4];
  uint x;
  undefined1 local_2e8 [16];
  undefined1 local_2d8 [16];
  undefined1 local_2c8 [28];
  int to_1;
  int *curedge;
  iterator iStack_2a0;
  int v_1;
  iterator __end2_1;
  iterator __begin2_1;
  vector<int,_std::allocator<int>_> *__range2_1;
  int local_274;
  iterator iStack_270;
  int v;
  iterator __end2;
  iterator __begin2;
  vector<int,_std::allocator<int>_> *__range2;
  uint local_250;
  uint uStack_24c;
  bool is_not_tangle;
  int t;
  undefined1 local_238 [16];
  undefined1 local_228 [24];
  undefined1 local_210 [4];
  int s;
  undefined1 local_200 [16];
  undefined1 local_1f0 [24];
  undefined1 local_1d8 [4];
  int to;
  int local_1c4;
  int *piStack_1c0;
  int w;
  int *edges;
  uint i;
  uint n;
  uint local_19c;
  uint local_198;
  int pl;
  int pr;
  bool new_tangles;
  int *str_local;
  bitset *R_local;
  TLSolver *pTStack_178;
  int startvertex_local;
  TLSolver *this_local;
  uintqueue *local_168;
  uint local_15c;
  uintqueue *local_158;
  undefined4 local_14c;
  uintqueue *local_148;
  uint local_13c;
  uintqueue *local_138;
  undefined4 local_12c;
  uintqueue *local_128;
  uint local_11c;
  uintqueue *local_118;
  undefined4 local_10c;
  uintqueue *local_108;
  uint local_fc;
  uintqueue *local_f8;
  uintqueue *local_f0;
  uintqueue *local_e8;
  uintqueue *local_e0;
  uintqueue *local_d8;
  uintqueue *local_d0;
  uintqueue *local_c8;
  uintqueue *local_c0;
  uintqueue *local_b8;
  uintqueue *local_b0;
  uintqueue *local_a8;
  uintqueue *local_a0;
  uintqueue *local_98;
  uintqueue *local_90;
  uintqueue *local_88;
  uintqueue *local_80;
  uintqueue *local_78;
  uint local_6c;
  uintqueue *local_68;
  undefined4 local_5c;
  uintqueue *local_58;
  uint local_4c;
  uintqueue *local_48;
  uint local_3c;
  uintqueue *local_38;
  char local_29;
  bitset *local_28;
  uintqueue *local_20;
  uintqueue *local_10;
  
  pl._3_1_ = 0;
  _pr = str;
  str_local = (int *)R;
  R_local._4_4_ = startvertex;
  pTStack_178 = this;
  local_198 = Solver::priority(&this->super_Solver,startvertex);
  local_19c = local_198 & 1;
  local_f8 = &this->pea_state;
  local_fc = R_local._4_4_;
  iVar10 = (this->pea_state).pointer;
  (this->pea_state).pointer = iVar10 + 1;
  local_f8->queue[iVar10] = R_local._4_4_;
  local_108 = &this->pea_state;
  local_10c = 0;
  iVar10 = (this->pea_state).pointer;
  (this->pea_state).pointer = iVar10 + 1;
  local_108->queue[iVar10] = 0;
  bitset::operator[]((bitset *)&i,(size_t)&this->pea_root);
  bitset::reference::operator=((reference *)&i,true);
  uVar4 = this->pea_curidx;
  this->pea_curidx = uVar4 + 1;
  this->pea_vidx[(int)R_local._4_4_] = uVar4;
LAB_002255f5:
  do {
    local_e8 = &this->pea_state;
    if ((this->pea_state).pointer == 0) {
      (this->pea_S).pointer = 0;
      return (bool)(pl._3_1_ & 1);
    }
LAB_0022561c:
    while( true ) {
      local_e0 = &this->pea_state;
      edges._4_4_ = local_e0->queue[(this->pea_state).pointer + -2];
      local_c0 = &this->pea_state;
      edges._0_4_ = local_c0->queue[(this->pea_state).pointer + -1];
      uVar4 = Solver::owner(&this->super_Solver,edges._4_4_);
      if (uVar4 != local_19c) {
        piStack_1c0 = Solver::outs(&this->super_Solver,edges._4_4_);
        if (((uint)edges != 0) &&
           (local_1c4 = piStack_1c0[(uint)edges - 1],
           this->pea_vidx[local_1c4] < this->pea_vidx[edges._4_4_])) {
          this->pea_vidx[edges._4_4_] = this->pea_vidx[local_1c4];
          bitset::operator[]((bitset *)local_1d8,(size_t)&this->pea_root);
          bitset::reference::operator=((reference *)local_1d8,false);
        }
        do {
          local_1f0._20_4_ = piStack_1c0[(uint)edges];
          if (local_1f0._20_4_ == 0xffffffff) goto LAB_00225b34;
          bitset::operator[]((bitset *)local_1f0,(size_t)str_local);
          bVar3 = bitset::reference::operator_cast_to_bool((reference *)local_1f0);
          if (bVar3) {
            if (this->pea_vidx[(int)local_1f0._20_4_] == 0) goto code_r0x002257c4;
            if (this->pea_vidx[(int)local_1f0._20_4_] < this->pea_vidx[edges._4_4_]) {
              this->pea_vidx[edges._4_4_] = this->pea_vidx[(int)local_1f0._20_4_];
              bitset::operator[]((bitset *)local_210,(size_t)&this->pea_root);
              bitset::reference::operator=((reference *)local_210,false);
            }
          }
          edges._0_4_ = (uint)edges + 1;
        } while( true );
      }
      local_228._20_4_ = _pr[edges._4_4_];
      if (((uint)edges != 0) || (this->pea_vidx[(int)local_228._20_4_] != 0)) break;
      local_d0 = &this->pea_state;
      local_d0->queue[(this->pea_state).pointer + -1] = 1;
      local_138 = &this->pea_state;
      iVar10 = (this->pea_state).pointer;
      (this->pea_state).pointer = iVar10 + 1;
      local_138->queue[iVar10] = local_228._20_4_;
      local_148 = &this->pea_state;
      local_14c = 0;
      iVar10 = (this->pea_state).pointer;
      (this->pea_state).pointer = iVar10 + 1;
      local_148->queue[iVar10] = 0;
      local_13c = local_228._20_4_;
      bitset::operator[]((bitset *)local_228,(size_t)&this->pea_root);
      bitset::reference::operator=((reference *)local_228,true);
      uVar4 = this->pea_curidx;
      this->pea_curidx = uVar4 + 1;
      this->pea_vidx[(int)local_228._20_4_] = uVar4;
    }
    if (this->pea_vidx[(int)local_228._20_4_] < this->pea_vidx[edges._4_4_]) {
      this->pea_vidx[edges._4_4_] = this->pea_vidx[(int)local_228._20_4_];
      bitset::operator[]((bitset *)local_238,(size_t)&this->pea_root);
      bitset::reference::operator=((reference *)local_238,false);
    }
LAB_00225b34:
    local_b8 = &this->pea_state;
    (this->pea_state).pointer = (this->pea_state).pointer + -2;
    bitset::operator[]((bitset *)&t,(size_t)&this->pea_root);
    bVar3 = bitset::reference::operator_cast_to_bool((reference *)&t);
    if (bVar3) {
      this->pea_curidx = this->pea_curidx + -1;
      uStack_24c = edges._4_4_;
      std::vector<int,_std::allocator<int>_>::push_back
                (&this->tangle,(value_type_conflict *)&stack0xfffffffffffffdb4);
      while (local_f0 = &this->pea_S, (this->pea_S).pointer != 0) {
        local_d8 = &this->pea_S;
        local_250 = local_d8->queue[(this->pea_S).pointer + -1];
        if (this->pea_vidx[(int)local_250] < this->pea_vidx[edges._4_4_]) break;
        local_b0 = &this->pea_S;
        (this->pea_S).pointer = (this->pea_S).pointer + -1;
        this->pea_curidx = this->pea_curidx + -1;
        this->pea_vidx[(int)local_250] = 0xffffffff;
        std::vector<int,_std::allocator<int>_>::push_back
                  (&this->tangle,(value_type_conflict *)&local_250);
      }
      this->pea_vidx[edges._4_4_] = 0xffffffff;
      sVar5 = std::vector<int,_std::allocator<int>_>::size(&this->tangle);
      local_479 = 0;
      if ((sVar5 == 1) && (local_479 = 0, _pr[edges._4_4_] != edges._4_4_)) {
        local_47a = 1;
        if (_pr[edges._4_4_] == -1) {
          bVar3 = Game::has_edge((this->super_Solver).game,edges._4_4_,edges._4_4_);
          local_47a = bVar3 ^ 0xff;
        }
        local_479 = local_47a;
      }
      if ((local_479 & 1) == 0) {
        __end2 = std::vector<int,_std::allocator<int>_>::begin(&this->tangle);
        iStack_270 = std::vector<int,_std::allocator<int>_>::end(&this->tangle);
        while (bVar3 = __gnu_cxx::operator!=(&__end2,&stack0xfffffffffffffd90), bVar3) {
          piVar8 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                   operator*(&__end2);
          local_274 = *piVar8;
          bitset::operator[]((bitset *)&__range2_1,(size_t)&this->escapes);
          bitset::reference::operator=((reference *)&__range2_1,true);
          __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
                    (&__end2);
        }
        __end2_1 = std::vector<int,_std::allocator<int>_>::begin(&this->tangle);
        iStack_2a0 = std::vector<int,_std::allocator<int>_>::end(&this->tangle);
        while (bVar3 = __gnu_cxx::operator!=(&__end2_1,&stack0xfffffffffffffd60), bVar3) {
          piVar8 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                   operator*(&__end2_1);
          curedge._4_4_ = *piVar8;
          uVar4 = Solver::owner(&this->super_Solver,curedge._4_4_);
          if (uVar4 != local_19c) {
            for (register0x00000000 = (uint *)Solver::outs(&this->super_Solver,curedge._4_4_);
                *stack0xfffffffffffffd50 != 0xffffffff;
                register0x00000000 = stack0xfffffffffffffd50 + 1) {
              local_2c8._20_4_ = *stack0xfffffffffffffd50;
              bitset::operator[]((bitset *)local_2c8,(size_t)&this->G);
              bVar3 = bitset::reference::operator_cast_to_bool((reference *)local_2c8);
              local_47b = 0;
              if (bVar3) {
                bitset::operator[]((bitset *)local_2d8,(size_t)&this->S);
                bVar3 = bitset::reference::operator_cast_to_bool((reference *)local_2d8);
                local_47b = 0;
                if (!bVar3) {
                  bitset::operator[]((bitset *)local_2e8,(size_t)&this->escapes);
                  bVar3 = bitset::reference::operator_cast_to_bool((reference *)local_2e8);
                  local_47b = bVar3 ^ 0xff;
                }
              }
              if ((local_47b & 1) != 0) {
                bitset::operator[]((bitset *)local_2f8,(size_t)&this->escapes);
                bitset::reference::operator=((reference *)local_2f8,true);
                local_168 = &this->tangleto;
                this_local._4_4_ = local_2c8._20_4_;
                iVar10 = (this->tangleto).pointer;
                (this->tangleto).pointer = iVar10 + 1;
                local_168->queue[iVar10] = local_2c8._20_4_;
              }
            }
          }
          __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
                    (&__end2_1);
        }
        sVar5 = std::vector<int,_std::allocator<int>_>::size(&this->tangle);
        local_78 = &this->tangleto;
        uVar4 = (this->tangleto).pointer;
        sVar6 = bitset::size(&this->escapes);
        if (sVar5 + uVar4 < sVar6 >> 6) {
          for (local_2fc = 0; local_80 = &this->tangleto, local_2fc < (uint)(this->tangleto).pointer
              ; local_2fc = local_2fc + 1) {
            local_38 = &this->tangleto;
            local_3c = local_2fc;
            bitset::operator[]((bitset *)&__range3,(size_t)&this->escapes);
            bitset::reference::operator=((reference *)&__range3,false);
          }
          __end3 = std::vector<int,_std::allocator<int>_>::begin(&this->tangle);
          iStack_328 = std::vector<int,_std::allocator<int>_>::end(&this->tangle);
          while (bVar3 = __gnu_cxx::operator!=(&__end3,&stack0xfffffffffffffcd8), bVar3) {
            piVar8 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                     operator*(&__end3);
            local_32c = *piVar8;
            bitset::operator[]((bitset *)&__range5,(size_t)&this->escapes);
            bitset::reference::operator=((reference *)&__range5,false);
            __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
                      (&__end3);
          }
        }
        else {
          local_28 = &this->escapes;
          __first = local_28->_bits;
          puVar1 = local_28->_bits;
          sVar6 = bitset::num_blocks(local_28);
          local_29 = '\0';
          std::fill<unsigned_long*,char>(__first,puVar1 + sVar6,&local_29);
        }
        local_20 = &this->tangleto;
        if ((this->tangleto).pointer == 0) {
          if ((this->super_Solver).trace != 0) {
            poVar7 = std::operator<<((this->super_Solver).logger,"\x1b[1;38;5;201mdominion \x1b[36m"
                                    );
            poVar7 = (ostream *)std::ostream::operator<<(poVar7,local_198);
            std::operator<<(poVar7,"\x1b[m");
            if (1 < (this->super_Solver).trace) {
              __end5 = std::vector<int,_std::allocator<int>_>::begin(&this->tangle);
              iStack_358 = std::vector<int,_std::allocator<int>_>::end(&this->tangle);
              while (bVar3 = __gnu_cxx::operator!=(&__end5,&stack0xfffffffffffffca8), bVar3) {
                piVar8 = __gnu_cxx::
                         __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                         operator*(&__end5);
                local_35c = *piVar8;
                poVar7 = std::operator<<((this->super_Solver).logger," \x1b[1;36m");
                _Var11 = Solver::label_vertex(&this->super_Solver,local_35c);
                local_380 = _Var11.g;
                local_378 = _Var11.v;
                local_370.g = local_380;
                local_370.v = local_378;
                poVar7 = operator<<(poVar7,&local_370);
                std::operator<<(poVar7,"\x1b[m");
                if (_pr[local_35c] != -1) {
                  poVar7 = std::operator<<((this->super_Solver).logger,"->");
                  _Var11 = Solver::label_vertex(&this->super_Solver,_pr[local_35c]);
                  local_390.g = _Var11.g;
                  local_390.v = _Var11.v;
                  operator<<(poVar7,&local_390);
                }
                __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                operator++(&__end5);
              }
            }
            std::ostream::operator<<
                      ((this->super_Solver).logger,std::endl<char,std::char_traits<char>>);
          }
          __end3_1 = std::vector<int,_std::allocator<int>_>::begin(&this->tangle);
          iStack_3b8 = std::vector<int,_std::allocator<int>_>::end(&this->tangle);
          while (bVar3 = __gnu_cxx::operator!=(&__end3_1,&stack0xfffffffffffffc48), bVar3) {
            piVar8 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                     operator*(&__end3_1);
            local_3bc = *piVar8;
            bitset::operator[]((bitset *)&__range4,(size_t)&this->S);
            bitset::reference::operator=((reference *)&__range4,true);
            __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
                      (&__end3_1);
          }
          this->dominions = this->dominions + 1;
          std::vector<int,_std::allocator<int>_>::clear(&this->tangle);
          pl._3_1_ = 1;
        }
        else {
          if (0 < (this->super_Solver).trace) {
            poVar7 = std::operator<<((this->super_Solver).logger,"\x1b[1;38;5;198mnew tangle ");
            poVar7 = (ostream *)std::ostream::operator<<(poVar7,local_198);
            poVar7 = std::operator<<(poVar7,"\x1b[m (");
            sVar5 = std::vector<int,_std::allocator<int>_>::size(&this->tpr);
            poVar7 = (ostream *)std::ostream::operator<<(poVar7,sVar5);
            std::operator<<(poVar7,")");
            if (1 < (this->super_Solver).trace) {
              __end4 = std::vector<int,_std::allocator<int>_>::begin(&this->tangle);
              iStack_3e8 = std::vector<int,_std::allocator<int>_>::end(&this->tangle);
              while (bVar3 = __gnu_cxx::operator!=(&__end4,&stack0xfffffffffffffc18), bVar3) {
                piVar8 = __gnu_cxx::
                         __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                         operator*(&__end4);
                local_3ec = *piVar8;
                poVar7 = std::operator<<((this->super_Solver).logger," \x1b[1;36m");
                _Var11 = Solver::label_vertex(&this->super_Solver,local_3ec);
                local_410 = _Var11.g;
                local_408 = _Var11.v;
                local_400.g = local_410;
                local_400.v = local_408;
                poVar7 = operator<<(poVar7,&local_400);
                std::operator<<(poVar7,"\x1b[m");
                if (_pr[local_3ec] != -1) {
                  poVar7 = std::operator<<((this->super_Solver).logger,"->");
                  _Var11 = Solver::label_vertex(&this->super_Solver,_pr[local_3ec]);
                  _x_1 = _Var11.g;
                  local_428 = _Var11.v;
                  local_420.g = _x_1;
                  local_420.v = local_428;
                  operator<<(poVar7,&local_420);
                }
                __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                operator++(&__end4);
              }
            }
            poVar7 = std::operator<<((this->super_Solver).logger," with ");
            local_88 = &this->tangleto;
            poVar7 = (ostream *)std::ostream::operator<<(poVar7,(this->tangleto).pointer);
            std::operator<<(poVar7," escape vertices.");
            std::ostream::operator<<
                      ((this->super_Solver).logger,std::endl<char,std::char_traits<char>>);
          }
          sVar5 = std::vector<int,_std::allocator<int>_>::size(&this->tpr);
          _tout._4_4_ = (undefined4)sVar5;
          for (_tout._0_4_ = 0; local_90 = &this->tangleto,
              (uint)_tout < (uint)(this->tangleto).pointer; _tout._0_4_ = (uint)_tout + 1) {
            local_48 = &this->tangleto;
            local_4c = (uint)_tout;
            std::vector<int,_std::allocator<int>_>::push_back
                      (this->tin + local_48->queue[(uint)_tout],
                       (value_type_conflict *)((long)&_tout + 4));
          }
          local_98 = &this->tangleto;
          auVar2 = ZEXT416((this->tangleto).pointer + 1) * ZEXT816(4);
          uVar9 = auVar2._0_8_;
          if (auVar2._8_8_ != 0) {
            uVar9 = 0xffffffffffffffff;
          }
          _vv = (int *)operator_new__(uVar9);
          local_58 = &this->tangleto;
          local_5c = 0;
          local_68 = &this->tangleto;
          local_a0 = &this->tangleto;
          local_6c = (this->tangleto).pointer;
          std::copy<unsigned_int*,int*>(local_58->queue,local_68->queue + local_6c,_vv);
          local_a8 = &this->tangleto;
          _vv[(uint)(this->tangleto).pointer] = -1;
          std::vector<int_*,_std::allocator<int_*>_>::push_back(&this->tout,&_vv);
          sVar5 = std::vector<int,_std::allocator<int>_>::size(&this->tangle);
          auVar2._8_8_ = 0;
          auVar2._0_8_ = sVar5 * 2 + 1;
          uVar9 = SUB168(auVar2 * ZEXT816(4),0);
          if (SUB168(auVar2 * ZEXT816(4),8) != 0) {
            uVar9 = 0xffffffffffffffff;
          }
          piStack_448 = (value_type)operator_new__(uVar9);
          __range2_2._4_4_ = 0;
          __end2_2 = std::vector<int,_std::allocator<int>_>::begin(&this->tangle);
          iStack_468 = std::vector<int,_std::allocator<int>_>::end(&this->tangle);
          while (bVar3 = __gnu_cxx::operator!=(&__end2_2,&stack0xfffffffffffffb98), bVar3) {
            piVar8 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                     operator*(&__end2_2);
            local_46c = *piVar8;
            iVar10 = __range2_2._4_4_ + 1;
            piStack_448[__range2_2._4_4_] = local_46c;
            __range2_2._4_4_ = __range2_2._4_4_ + 2;
            piStack_448[iVar10] = _pr[local_46c];
            __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
                      (&__end2_2);
          }
          piStack_448[__range2_2._4_4_] = -1;
          std::vector<int_*,_std::allocator<int_*>_>::push_back(&this->tv,&stack0xfffffffffffffbb8);
          std::vector<int,_std::allocator<int>_>::push_back
                    (&this->tpr,(value_type_conflict *)&local_198);
          local_470 = 0;
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                    (&this->tescs,&local_470);
          this->tangles = this->tangles + 1;
          std::vector<int,_std::allocator<int>_>::clear(&this->tangle);
          local_10 = &this->tangleto;
          (this->tangleto).pointer = 0;
          pl._3_1_ = 1;
        }
      }
      else {
        std::vector<int,_std::allocator<int>_>::clear(&this->tangle);
      }
      goto LAB_002255f5;
    }
    local_158 = &this->pea_S;
    local_15c = edges._4_4_;
    iVar10 = (this->pea_S).pointer;
    (this->pea_S).pointer = iVar10 + 1;
    local_158->queue[iVar10] = edges._4_4_;
  } while( true );
code_r0x002257c4:
  local_c8 = &this->pea_state;
  local_c8->queue[(this->pea_state).pointer + -1] = (uint)edges + 1;
  local_118 = &this->pea_state;
  local_11c = local_1f0._20_4_;
  iVar10 = (this->pea_state).pointer;
  (this->pea_state).pointer = iVar10 + 1;
  local_118->queue[iVar10] = local_1f0._20_4_;
  local_128 = &this->pea_state;
  local_12c = 0;
  iVar10 = (this->pea_state).pointer;
  (this->pea_state).pointer = iVar10 + 1;
  local_128->queue[iVar10] = 0;
  bitset::operator[]((bitset *)local_200,(size_t)&this->pea_root);
  bitset::reference::operator=((reference *)local_200,true);
  uVar4 = this->pea_curidx;
  this->pea_curidx = uVar4 + 1;
  this->pea_vidx[(int)local_1f0._20_4_] = uVar4;
  goto LAB_0022561c;
}

Assistant:

bool
TLSolver::extractTangles(int startvertex, bitset &R, int *str)
{
    bool new_tangles = false;
    const int pr = priority(startvertex);
    const int pl = pr&1;

    /**
     * The following is the nonrecursive implementation of David Pearce,
     * "A space-efficient algorithm for finding strongly connected components" (IPL, 2016),
     * modified to on-the-fly restrict the graph by <R> and <str>.
     */

    // beginVisiting
    pea_state.push(startvertex);
    pea_state.push(0);
    pea_root[startvertex] = true;
    pea_vidx[startvertex] = pea_curidx++;
    while (pea_state.nonempty()) {
pearce_again:
        // visitLoop
        const unsigned int n = pea_state.back2();
        unsigned int i = pea_state.back();

        if (owner(n) != pl) {
            auto edges = outs(n);
            if (i>0) {
                // finishEdge
                const int w = edges[i-1];
                if (pea_vidx[w] < pea_vidx[n]) {
                    pea_vidx[n] = pea_vidx[w];
                    pea_root[n] = false;
                }
            }
            for (;;) {
                const int to = edges[i];
                if (to == -1) break; // done
                // beginEdge
                if (R[to]) {
                    if (pea_vidx[to] == 0) {
                        pea_state.back() = i+1;
                        // beginVisiting
                        pea_state.push(to);
                        pea_state.push(0);
                        pea_root[to] = true;
                        pea_vidx[to] = pea_curidx++;
                        goto pearce_again; // break; continue;
                    } else {
                        // finishEdge
                        if (pea_vidx[to] < pea_vidx[n]) {
                            pea_vidx[n] = pea_vidx[to];
                            pea_root[n] = false;
                        }
                    }
                }
                i++;
            }
        } else {
            const int s = str[n];
            if (i == 0) {
                // beginEdge
                if (pea_vidx[s] == 0) {
                    pea_state.back() = 1;
                    // beginVisiting
                    pea_state.push(s);
                    pea_state.push(0);
                    pea_root[s] = true;
                    pea_vidx[s] = pea_curidx++;
                    goto pearce_again; // break; continue;
                }
            }
            // finishEdge
            if (pea_vidx[s] < pea_vidx[n]) {
                pea_vidx[n] = pea_vidx[s];
                pea_root[n] = false;
            }
        }
        // finishVisiting
        pea_state.pop2();
        if (pea_root[n]) {
            pea_curidx -= 1;
            tangle.push_back(n);
            while (pea_S.nonempty()) {
                const int t = pea_S.back();
                if (pea_vidx[n]>pea_vidx[t]) break;
                pea_S.pop();
                pea_curidx -= 1;
                pea_vidx[t] = (unsigned int)-1;
                tangle.push_back(t);
            }
            pea_vidx[n] = (unsigned int)-1;
        } else {
            pea_S.push(n);
            continue;
        }

        /**
         * End of Pearce's algorithm.
         * At this point, we have an SCC in <tangle>.
         *
         * Now check if the SCC is nontrivial, i.e., contains a cycle, i.e., either 2+ vertices
         * or a self-loop.
         */

        const bool is_not_tangle = (tangle.size() == 1) and
            ((unsigned int)str[n] != n) and (str[n] != -1 or !game.has_edge(n, n));
        if (is_not_tangle) {
            // std::cout << "not a tangle: " << pea_vidx[n] << std::endl;
            tangle.clear();
            continue;
        }

        /**
         * We have a tangle. Compute the outgoing edges (into <tangleto>) and the next highest region.
         */

        for (const int v : tangle) escapes[v] = true;

        for (const int v : tangle) {
            if (owner(v) != pl) {
                for (auto curedge = outs(v); *curedge != -1; curedge++) {
                    int to = *curedge;
                    if (G[to] and !S[to] && !escapes[to]) {
                        escapes[to] = true;
                        tangleto.push(to);
                    }
                }
            }
        }

        if ((tangle.size()+tangleto.size()) < (escapes.size()/64)) {
            for (unsigned int x = 0; x < tangleto.size(); x++) escapes[tangleto[x]] = false;
            for (const int v : tangle) escapes[v] = false;
        } else {
            escapes.reset(); // this is very expensive on large practical games with many small tangles
        }

        /**
         * If there are no outgoing edges, then we have found a dominion.
         */

        if (tangleto.empty()) {
            // dominion
#ifndef NDEBUG
            if (trace) {
                logger << "\033[1;38;5;201mdominion \033[36m" << pr << "\033[m";
                if (trace >= 2) {
                    for (const int v : tangle) {
                        logger << " \033[1;36m" << label_vertex(v) << "\033[m";
                        if (str[v] != -1) logger << "->" << label_vertex(str[v]);
                    }
                }
                logger << std::endl;
            }
#endif
            for (const int v : tangle) S[v] = true;
            dominions++;
            tangle.clear();
            new_tangles = true;
            continue;
        }

        /**
         * We're not a dominion, we're a tangle.
         */

#ifndef NDEBUG
        if (trace >= 1) {
            logger << "\033[1;38;5;198mnew tangle " << pr << "\033[m (" << tpr.size() << ")";
            if (trace >= 2) {
                for (const int v : tangle) {
                    logger << " \033[1;36m" << label_vertex(v) << "\033[m";
                    if (str[v] != -1) logger << "->" << label_vertex(str[v]);
                }
            }
            logger << " with " << tangleto.size() << " escape vertices.";
            logger << std::endl;
        }
#endif

        // new tangle idx
        const int tidx = tpr.size();

        // add back links to all normal vertices in our [out]
        for (unsigned int x = 0; x < tangleto.size(); x++) tin[tangleto[x]].push_back(tidx);

        // move tangleto into vout
        int* _tout = new int[tangleto.size()+1];
        std::copy(&tangleto[0], &tangleto[tangleto.size()], _tout);
        _tout[tangleto.size()] = -1;
        tout.push_back(_tout);

        // move tangle into vv
        int* _vv = new int[tangle.size()*2+1], c=0;
        for (const int v : tangle) {
            _vv[c++] = v;
            _vv[c++] = str[v];
        }
        _vv[c] = -1;
        tv.push_back(_vv);

        // and set p to pr
        tpr.push_back(pr);
        tescs.push_back(0);

        tangles++;
        tangle.clear();
        tangleto.clear();
        new_tangles = true;
    }

    pea_S.clear();
    return new_tangles;
}